

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wsi.c
# Opt level: O3

int lws_callback_all_protocol(lws_context *context,lws_protocols *protocol,int reason)

{
  lws *plVar1;
  int iVar2;
  lws_context_per_thread *plVar3;
  ulong uVar4;
  
  iVar2 = (int)context->count_threads;
  if (context->count_threads != 0) {
    plVar3 = context->pt;
    do {
      if (plVar3->fds_count != 0) {
        uVar4 = 0;
        do {
          plVar1 = wsi_from_fd(context,plVar3->fds[uVar4].fd);
          if ((plVar1 != (lws *)0x0) && (plVar1->protocol == protocol)) {
            (*protocol->callback)(plVar1,reason,plVar1->user_space,(void *)0x0,0);
          }
          uVar4 = uVar4 + 1;
        } while (uVar4 < plVar3->fds_count);
      }
      iVar2 = iVar2 + -1;
      plVar3 = plVar3 + 1;
    } while (iVar2 != 0);
  }
  return 0;
}

Assistant:

int
lws_callback_all_protocol(struct lws_context *context,
			  const struct lws_protocols *protocol, int reason)
{
	struct lws_context_per_thread *pt = &context->pt[0];
	unsigned int n, m = context->count_threads;
	struct lws *wsi;

	while (m--) {
		for (n = 0; n < pt->fds_count; n++) {
			wsi = wsi_from_fd(context, pt->fds[n].fd);
			if (!wsi)
				continue;
			if (wsi->protocol == protocol)
				protocol->callback(wsi, reason, wsi->user_space,
						   NULL, 0);
		}
		pt++;
	}

	return 0;
}